

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticsReporter_TypeChecker.cpp
# Opt level: O2

void __thiscall
psy::C::TypeChecker::DiagnosticsReporter::ExpectedExpressionOfPointerOrArrayType
          (DiagnosticsReporter *this,SyntaxToken *tk)

{
  allocator<char> local_69;
  SyntaxToken local_68;
  string local_28;
  
  local_68.field_10 = tk->field_10;
  local_68.tree_ = tk->tree_;
  local_68.syntaxK_ = tk->syntaxK_;
  local_68.byteSize_ = tk->byteSize_;
  local_68.charSize_ = tk->charSize_;
  local_68._14_2_ = *(undefined2 *)&tk->field_0xe;
  local_68.byteOffset_ = tk->byteOffset_;
  local_68.charOffset_ = tk->charOffset_;
  local_68.matchingBracket_ = tk->matchingBracket_;
  local_68.field_7 = tk->field_7;
  local_68._34_2_ = *(undefined2 *)&tk->field_0x22;
  local_68.lineno_ = tk->lineno_;
  local_68.column_ = tk->column_;
  local_68._44_4_ = *(undefined4 *)&tk->field_0x2c;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"pointer or array",&local_69);
  ExpectedExpressionOfType_CORE
            (this,&local_68,&ID_of_ExpectedExpressionOfPointerOrArrayType_abi_cxx11_,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  SyntaxToken::~SyntaxToken(&local_68);
  return;
}

Assistant:

void TypeChecker::DiagnosticsReporter::ExpectedExpressionOfPointerOrArrayType(SyntaxToken tk)
{
    ExpectedExpressionOfType_CORE(
                tk,
                ID_of_ExpectedExpressionOfPointerOrArrayType,
                "pointer or array");
}